

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendBuffer.h
# Opt level: O0

void __thiscall SendBuffer::load_bytes(SendBuffer *this,char *source,int bytes)

{
  char cVar1;
  ulong uVar2;
  Error *this_00;
  char *pcVar3;
  int local_30;
  int p;
  int bytes_local;
  char *source_local;
  SendBuffer *this_local;
  
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < (ulong)(long)bytes) {
    this_00 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(this_00,"Too many bytes to read");
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  for (local_30 = 0; local_30 < bytes; local_30 = local_30 + 1) {
    cVar1 = source[local_30];
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    *pcVar3 = cVar1;
  }
  this->full = bytes;
  this->read = 0;
  return;
}

Assistant:

void load_bytes(char *source, int bytes) {
    if (bytes > buf.size())
      throw Error("Too many bytes to read");
    for (int p = 0; p < bytes; ++p) {
      buf[p] = *(source + p);
    }
    full = bytes;
    read = 0;
  }